

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O3

Point * __thiscall
IceMaths::Point::Refract(Point *this,Point *eye,Point *n,float refractindex,Point *refracted)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar8 = eye->z - this->z;
  fVar1 = n->z;
  uVar2 = eye->x;
  uVar5 = eye->y;
  uVar3 = this->x;
  uVar6 = this->y;
  uVar4 = n->x;
  uVar7 = n->y;
  fVar9 = (fVar1 * fVar8 +
          (float)uVar4 * ((float)uVar2 - (float)uVar3) +
          ((float)uVar5 - (float)uVar6) * (float)uVar7) / refractindex;
  fVar10 = fVar1 * fVar1 + (float)uVar4 * (float)uVar4 + (float)uVar7 * (float)uVar7;
  refracted->x = fVar9 * (float)uVar4 - fVar10 * ((float)uVar2 - (float)uVar3);
  refracted->y = fVar9 * (float)uVar7 - fVar10 * ((float)uVar5 - (float)uVar6);
  refracted->z = fVar1 * fVar9 - fVar8 * fVar10;
  return this;
}

Assistant:

Point& Point::Refract(const Point& eye, const Point& n, float refractindex, Point& refracted)
{
	//	Point EyePt = eye position
	//	Point p = current vertex
	//	Point n = vertex normal
	//	Point rv = refracted vector
	//	Eye vector - doesn't need to be normalized
	Point Env;
	Env.x = eye.x - x;
	Env.y = eye.y - y;
	Env.z = eye.z - z;

	float NDotE = n|Env;
	float NDotN = n|n;
	NDotE /= refractindex;

	// Refracted vector
	refracted = n*NDotE - Env*NDotN;

	return *this;
}